

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  ImGuiWindow *window;
  ImDrawList *pIVar4;
  _func_void_ImDrawData_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  ImDrawList **ppIVar8;
  int iVar9;
  ImGuiWindow *pIVar10;
  ulong uVar11;
  int n;
  ImGuiWindow *pIVar12;
  long lVar13;
  ImGuiWindow *windows_to_render_front_most [2];
  ImGuiWindow *local_38 [2];
  
  pIVar5 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar5->FrameCountRendered = pIVar5->FrameCount;
  (pIVar5->IO).MetricsRenderWindows = 0;
  (pIVar5->IO).MetricsRenderVertices = 0;
  (pIVar5->IO).MetricsRenderIndices = 0;
  out_list = &pIVar5->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  pIVar10 = pIVar5->NavWindowingTarget;
  if ((pIVar10 == (ImGuiWindow *)0x0) || ((pIVar10->Flags & 0x2000) != 0)) {
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar12 = pIVar10->RootWindow;
  }
  local_38[0] = pIVar12;
  if (pIVar10 == (ImGuiWindow *)0x0) {
    pIVar10 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar10 = pIVar5->NavWindowingList;
  }
  local_38[1] = pIVar10;
  if ((pIVar5->Windows).Size != 0) {
    uVar11 = 0;
    do {
      window = (pIVar5->Windows).Data[uVar11];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar10 && window != pIVar12) && (window->Flags & 0x1000000) == 0)) {
        AddWindowToDrawDataSelectLayer(window);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)(pIVar5->Windows).Size);
  }
  lVar13 = 0;
  do {
    pIVar10 = local_38[lVar13];
    if (((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->Active == true)) && (pIVar10->Hidden == false)
       ) {
      AddWindowToDrawDataSelectLayer(pIVar10);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 == 1);
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar5->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar5->OverlayDrawList,(pIVar5->IO).MousePos,
                      (pIVar5->Style).MouseCursorScale,pIVar5->MouseCursor);
  }
  if ((pIVar5->OverlayDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar5->OverlayDrawList);
  }
  pIVar6 = GImGui;
  (pIVar5->DrawData).Valid = true;
  iVar3 = (pIVar5->DrawDataBuilder).Layers[0].Size;
  if ((long)iVar3 < 1) {
    ppIVar8 = (ImDrawList **)0x0;
  }
  else {
    ppIVar8 = (pIVar5->DrawDataBuilder).Layers[0].Data;
  }
  (pIVar5->DrawData).CmdLists = ppIVar8;
  (pIVar5->DrawData).CmdListsCount = iVar3;
  (pIVar5->DrawData).TotalIdxCount = 0;
  (pIVar5->DrawData).TotalVtxCount = 0;
  (pIVar5->DrawData).DisplayPos.x = 0.0;
  (pIVar5->DrawData).DisplayPos.y = 0.0;
  (pIVar5->DrawData).DisplaySize = (pIVar6->IO).DisplaySize;
  if (0 < iVar3) {
    iVar7 = (pIVar5->DrawData).TotalIdxCount;
    iVar9 = (pIVar5->DrawData).TotalVtxCount;
    lVar13 = 0;
    do {
      pIVar4 = (pIVar5->DrawDataBuilder).Layers[0].Data[lVar13];
      iVar9 = iVar9 + (pIVar4->VtxBuffer).Size;
      iVar7 = iVar7 + (pIVar4->IdxBuffer).Size;
      lVar13 = lVar13 + 1;
    } while (iVar3 != lVar13);
    (pIVar5->DrawData).TotalVtxCount = iVar9;
    (pIVar5->DrawData).TotalIdxCount = iVar7;
  }
  uVar1 = (pIVar5->DrawData).TotalIdxCount;
  uVar2 = (pIVar5->DrawData).TotalVtxCount;
  (pIVar5->IO).MetricsRenderVertices = uVar2;
  (pIVar5->IO).MetricsRenderIndices = uVar1;
  if ((0 < (pIVar5->DrawData).CmdListsCount) &&
     (UNRECOVERED_JUMPTABLE = (pIVar5->IO).RenderDrawListsFn,
     UNRECOVERED_JUMPTABLE != (_func_void_ImDrawData_ptr *)0x0)) {
    (*UNRECOVERED_JUMPTABLE)(&pIVar5->DrawData);
    return;
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather ImDrawList to render (for each active window)
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();
    ImGuiWindow* windows_to_render_front_most[2];
    windows_to_render_front_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_front_most[1] = g.NavWindowingTarget ? g.NavWindowingList : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_front_most[0] && window != windows_to_render_front_most[1])
            AddWindowToDrawDataSelectLayer(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_front_most); n++)
        if (windows_to_render_front_most[n] && IsWindowActiveAndVisible(windows_to_render_front_most[n])) // NavWindowingTarget is always temporarily displayed as the front-most window
            AddWindowToDrawDataSelectLayer(windows_to_render_front_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.OverlayDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor);

    if (!g.OverlayDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.OverlayDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}